

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::ObliviousExecute(Alice *this)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  reference pvVar5;
  long lVar6;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_00;
  double dVar7;
  double dVar8;
  double temp;
  double next_pc;
  string local_80 [32];
  long local_60;
  long beta;
  int b;
  int a;
  long local_48;
  undefined1 local_40 [8];
  Message msg_from_Bob;
  Message msg_for_Bob;
  Alice *this_local;
  
  if (ObliviousExecute()::fout == '\0') {
    iVar2 = __cxa_guard_acquire(&ObliviousExecute()::fout);
    if (iVar2 != 0) {
      std::ofstream::ofstream(ObliviousExecute()::fout,"../debug/alice/Debug_A.txt",0x10);
      __cxa_atexit(std::ofstream::~ofstream,ObliviousExecute()::fout,&__dso_handle);
      __cxa_guard_release(&ObliviousExecute()::fout);
    }
  }
  poVar3 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: Oblivious Execute Run # ");
  iVar2 = ObliviousExecute::count;
  ObliviousExecute::count = ObliviousExecute::count + 1;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: pc = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->super_Party).pc);
  std::operator<<(poVar3,"\n");
  Message::Message((Message *)&msg_from_Bob.scalar2);
  Message::Message((Message *)local_40);
  pvVar4 = std::
           vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ::operator[](&(this->super_Party).P,(this->super_Party).pc);
  pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,0);
  msg_from_Bob.scalar2 = *pvVar5;
  pvVar4 = std::
           vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ::operator[](&(this->super_Party).P,(this->super_Party).pc);
  pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,1);
  lVar6 = *pvVar5;
  Server::Send(this->srv,(Message *)&msg_from_Bob.scalar2);
  poVar3 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: Msg sent to Bob : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,msg_from_Bob.scalar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar6);
  std::operator<<(poVar3,"\n");
  _b = Server::Receive(this->srv);
  local_40 = (undefined1  [8])_b;
  msg_from_Bob.scalar1 = local_48;
  poVar3 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: Msg rcvd from Bob: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(long)local_40);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,msg_from_Bob.scalar1);
  std::operator<<(poVar3,"\n");
  pvVar4 = std::
           vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ::operator[](&(this->super_Party).P,(this->super_Party).pc);
  pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,0);
  beta._4_4_ = (int)*pvVar5 + local_40._0_4_;
  pvVar4 = std::
           vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ::operator[](&(this->super_Party).P,(this->super_Party).pc);
  pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,1);
  beta._0_4_ = (int)*pvVar5 + (int)msg_from_Bob.scalar1;
  poVar3 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: a = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,beta._4_4_);
  poVar3 = std::operator<<(poVar3," b = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)beta);
  std::operator<<(poVar3,"\n");
  if (((beta._4_4_ < 0) || ((int)beta < 0)) || ((beta._4_4_ == 0 && ((int)beta == 0)))) {
    (this->super_Party).termination_condition = true;
  }
  else {
    this_00 = &(this->super_Party).D;
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](this_00,(long)beta._4_4_);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,0);
    lVar6 = *pvVar5;
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](this_00,(long)(int)beta);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,0);
    lVar1 = *pvVar5;
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](this_00,(long)beta._4_4_);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,0);
    *pvVar5 = lVar6 - lVar1;
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](this_00,(long)beta._4_4_);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,0);
    (this->super_Party).output = *pvVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,">=",(allocator *)((long)&next_pc + 7));
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&(this->super_Party).D,(long)beta._4_4_);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,0);
    lVar6 = ObliviousComparison(this,(string *)local_80,0,*pvVar5);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&next_pc + 7));
    local_60 = lVar6;
    poVar3 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: OC output  beta\' = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_60);
    std::operator<<(poVar3,"\n");
    lVar6 = local_60;
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&(this->super_Party).P,(this->super_Party).pc);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,2);
    dVar7 = ObliviousMultiplication(this,lVar6,*pvVar5);
    poVar3 = std::operator<<((ostream *)ObliviousExecute()::fout,
                             "Alice: OM output beta\'* P\'[pc][2] : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    std::operator<<(poVar3,"\n");
    lVar6 = 1 - local_60;
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&(this->super_Party).P,(this->super_Party).pc);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,3);
    dVar8 = ObliviousMultiplication(this,lVar6,*pvVar5);
    poVar3 = std::operator<<((ostream *)ObliviousExecute()::fout,
                             "Alice: OM output (1-beta\')(P\'[pc][3]) : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
    std::operator<<(poVar3,"\n");
    (this->super_Party).pc = (long)(dVar7 + dVar8);
  }
  return;
}

Assistant:

void Alice::ObliviousExecute()
{
    static std::ofstream fout("../debug/alice/Debug_A.txt");
    static int count = 0;
    fout<<"Alice: Oblivious Execute Run # "<<count++<<"\n";
    fout<<"Alice: pc = "<<pc<<"\n";
    /*------- Step 1 -------*/
    Message msg_for_Bob, msg_from_Bob;
    msg_for_Bob.scalar1 = P[pc][0];
    msg_for_Bob.scalar2 = P[pc][1];
    srv->Send(msg_for_Bob);
    fout<<"Alice: Msg sent to Bob : "<<msg_for_Bob.scalar1 << " "<<msg_for_Bob.scalar2<<"\n";
    msg_from_Bob = srv->Receive();
    fout<<"Alice: Msg rcvd from Bob: "<<msg_from_Bob.scalar1<<" "<<msg_from_Bob.scalar2<<"\n";
    /*------- Step 2 -------*/
    int a = P[pc][0] + msg_from_Bob.scalar1;
    int b = P[pc][1] + msg_from_Bob.scalar2;
    fout<<"Alice: a = "<<a<<" b = "<<b<<"\n";
    if(a<0 || b<0||(a==0 && b==0)){
        termination_condition = true;
        return;
    }
    /*------- Step 3 -------*/
    D[a][0] = D[a][0] - D[b][0];
    output = D[a][0];
    /*------- Step 4 -------*/
    long beta = ObliviousComparison(">=", 0, D[a][0]);
    fout<<"Alice: OC output  beta' = "<<beta<<"\n";
    /*------- Step 5 -------*/
    double next_pc = ObliviousMultiplication(beta, P[pc][2]);
    fout<< "Alice: OM output beta'* P'[pc][2] : "<<next_pc<<"\n";
    double temp = ObliviousMultiplication(1-beta, P[pc][3]);
    fout<< "Alice: OM output (1-beta')(P'[pc][3]) : "<<temp<<"\n";
    pc = next_pc+temp;    
}